

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O1

block_s * block_new(void)

{
  uint16_t *puVar1;
  undefined8 *puVar2;
  int iVar3;
  block_s *__addr;
  void *__addr_00;
  block_s *extraout_RAX;
  block_s *extraout_RAX_00;
  undefined8 in_RCX;
  fio_ls_embd_s *pfVar4;
  long lVar5;
  fio_ls_embd_s *pfVar6;
  block_s *pbVar7;
  ulong __len;
  undefined8 in_RSI;
  fio_ls_embd_s *pfVar8;
  timespec *in_RDI;
  size_t __len_00;
  fio_lock_i ret;
  undefined8 uStack_910;
  long *plStack_908;
  undefined1 *puStack_900;
  undefined1 auStack_8f0 [8];
  undefined8 uStack_8e8;
  fio_ls_embd_s *pfStack_8d8;
  char acStack_840 [2016];
  char acStack_60 [32];
  undefined8 uStack_40;
  timespec local_38;
  
  LOCK();
  UNLOCK();
  local_38.tv_sec = CONCAT71(local_38.tv_sec._1_7_,memory.lock);
  if (memory.lock != '\0') {
    do {
      memory.lock = '\x01';
      local_38.tv_sec = 0;
      local_38.tv_nsec = 1;
      in_RSI = 0;
      uStack_40 = 0x13f167;
      in_RDI = &local_38;
      nanosleep(&local_38,(timespec *)0x0);
      LOCK();
      UNLOCK();
      local_38.tv_sec = CONCAT71(local_38.tv_sec._1_7_,memory.lock);
    } while (memory.lock != '\0');
  }
  pfVar6 = memory.available.prev;
  memory.lock = '\x01';
  pfVar8 = (memory.available.prev)->next;
  pfVar4 = (fio_ls_embd_s *)CONCAT71((int7)((ulong)in_RCX >> 8),pfVar8 == (fio_ls_embd_s *)0x0);
  if (pfVar8 == memory.available.prev || pfVar8 == (fio_ls_embd_s *)0x0) {
    pfVar6 = (fio_ls_embd_s *)0x0;
  }
  else {
    pfVar8->prev = (memory.available.prev)->prev;
    pfVar4 = pfVar6->prev;
    pfVar4->next = pfVar8;
    pfVar6->next = pfVar6;
    pfVar6->prev = pfVar6;
  }
  if (pfVar6 != (fio_ls_embd_s *)0x0) {
    pbVar7 = (block_s *)(pfVar6 + -1);
    if (((ulong)pbVar7 & 0x7fff) != 0) {
      uStack_40 = 0x13f339;
      block_new_cold_1();
      puStack_900 = auStack_8f0;
      plStack_908 = &local_38.tv_nsec;
      uStack_910 = 0x3000000008;
      uStack_8e8 = in_RSI;
      pfStack_8d8 = pfVar4;
      iVar3 = vsnprintf(acStack_840,0x7fe,(char *)in_RDI,&uStack_910);
      if (iVar3 - 0x7feU < 0xfffff803) {
        if (iVar3 < 0x7fe) {
          FIO_LOG2STDERR_cold_1();
          return extraout_RAX_00;
        }
        builtin_strncpy(acStack_60 + 0x10,"uncated).",9);
        builtin_strncpy(acStack_60,"... (warning: tr",0x10);
      }
      FIO_LOG2STDERR_cold_2();
      return extraout_RAX;
    }
    *(undefined4 *)&pfVar6[-1].next = 0x20001;
    pfVar6->prev = (fio_ls_embd_s *)0x0;
    pfVar6->next = (fio_ls_embd_s *)0x0;
    LOCK();
    puVar1 = &pbVar7->parent->root_ref;
    *puVar1 = *puVar1 + 1;
    UNLOCK();
    goto LAB_0013f308;
  }
  pbVar7 = (block_s *)0x0;
  uStack_40 = 0x13f201;
  __addr = (block_s *)mmap(sys_alloc_next_alloc,0x800000,3,0x22,-1,0);
  if (__addr != (block_s *)0xffffffffffffffff) {
    pbVar7 = __addr;
    if (((ulong)__addr & 0x7fff) != 0) {
      uStack_40 = 0x13f221;
      munmap(__addr,0x800000);
      pbVar7 = (block_s *)0x0;
      uStack_40 = 0x13f242;
      __addr_00 = mmap((void *)0x0,0x808000,3,0x22,-1,0);
      if (__addr_00 == (void *)0xffffffffffffffff) goto LAB_0013f290;
      __len = (ulong)((uint)__addr_00 & 0x7fff);
      lVar5 = -__len;
      __len_00 = lVar5 + 0x8000;
      uStack_40 = 0x13f268;
      munmap(__addr_00,__len_00);
      pbVar7 = (block_s *)(__len_00 + (long)__addr_00);
      uStack_40 = 0x13f27f;
      munmap((void *)((long)__addr_00 + lVar5 + 0x808000),__len);
    }
    sys_alloc_next_alloc = pbVar7 + 0x80000;
  }
LAB_0013f290:
  if (pbVar7 == (block_s *)0x0) {
    LOCK();
    UNLOCK();
    memory.lock = '\0';
    return (block_s *)0x0;
  }
  if (4 < FIO_LOG_LEVEL) {
    uStack_40 = 0x13f2b3;
    FIO_LOG2STDERR("DEBUG (/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:7170): memory allocator allocated %p from the system"
                   ,pbVar7);
  }
  pbVar7->parent = pbVar7;
  *(fio_ls_embd_s **)&pbVar7->ref = (fio_ls_embd_s *)0x1000000020001;
  lVar5 = 0x8000;
  do {
    puVar2 = (undefined8 *)((long)&pbVar7->parent + lVar5);
    pfVar8 = (fio_ls_embd_s *)(puVar2 + 2);
    *puVar2 = pbVar7;
    puVar2[1] = 0x1000000020001;
    pfVar8->prev = memory.available.prev;
    puVar2[3] = &memory;
    (memory.available.prev)->next = pfVar8;
    lVar5 = lVar5 + 0x8000;
    memory.available.prev = pfVar8;
  } while ((int)lVar5 != 0x800000);
LAB_0013f308:
  LOCK();
  UNLOCK();
  memory.lock = '\0';
  return pbVar7;
}

Assistant:

void __attribute__((format(printf, 1, 0), weak))
FIO_LOG2STDERR(const char *format, ...) {
  char tmp___log[FIO_LOG____LENGTH_ON_STACK];
  va_list argv;
  va_start(argv, format);
  int len___log = vsnprintf(tmp___log, FIO_LOG_LENGTH_LIMIT - 2, format, argv);
  va_end(argv);
  if (len___log <= 0 || len___log >= FIO_LOG_LENGTH_LIMIT - 2) {
    if (len___log >= FIO_LOG_LENGTH_LIMIT - 2) {
      memcpy(tmp___log + FIO_LOG____LENGTH_BORDER, "... (warning: truncated).",
             25);
      len___log = FIO_LOG____LENGTH_BORDER + 25;
    } else {
      fwrite("ERROR: log output error (can't write).\n", 39, 1, stderr);
      return;
    }
  }
  tmp___log[len___log++] = '\n';
  tmp___log[len___log] = '0';
  fwrite(tmp___log, len___log, 1, stderr);
}